

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O2

void __thiscall CSocekt::initconnection(CSocekt *this)

{
  flyd_connection_s *this_00;
  int i;
  int iVar1;
  lp_connection_t p_Conn;
  CMemory *local_38;
  
  local_38 = CMemory::GetInstance();
  for (iVar1 = 0; iVar1 < this->m_worker_connections; iVar1 = iVar1 + 1) {
    this_00 = (flyd_connection_s *)CMemory::AllocMemory(local_38,0x120,true);
    p_Conn = this_00;
    flyd_connection_s::flyd_connection_s(this_00);
    p_Conn = this_00;
    flyd_connection_s::GetOneToUse(this_00);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
              (&this->m_connectionList,&p_Conn);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
              (&this->m_freeconnectionList,&p_Conn);
  }
  LOCK();
  (this->m_free_connection_n).value_ =
       (int)(this->m_connectionList).
            super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
            _M_node._M_size;
  UNLOCK();
  LOCK();
  (this->m_total_connection_n).value_ =
       (int)(this->m_connectionList).
            super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
            _M_node._M_size;
  UNLOCK();
  return;
}

Assistant:

void CSocekt::initconnection()
{
    lp_connection_t p_Conn;
    CMemory *p_memory = CMemory::GetInstance();   

    int ilenconnpool = sizeof(flyd_connection_t);    
    for(int i = 0; i < m_worker_connections; ++i) //先创建这么多个连接，后续不够再增加
    {
        p_Conn = (lp_connection_t)p_memory->AllocMemory(ilenconnpool,true); //清理内存 , 因为这里分配内存new char，无法执行构造函数，所以如下：
        //手工调用构造函数，因为AllocMemory里无法调用构造函数
        //定位new就是先分配了内存，再把地址p_Conn交给flyd_connection_t
        p_Conn = new(p_Conn) flyd_connection_t();  //定位new【不懂请百度】，释放则显式调用p_Conn->~ngx_connection_t();		
        p_Conn->GetOneToUse();
        m_connectionList.push_back(p_Conn);     //所有链接【不管是否空闲】都放在这个list
        m_freeconnectionList.push_back(p_Conn); //空闲连接会放在这个list
    } //end for
    m_free_connection_n.getAndSet(m_connectionList.size());
    m_total_connection_n.getAndSet(m_connectionList.size());
    return;
}